

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecialFormat.cpp
# Opt level: O1

TrackData * GenerateEmptyTrack(TrackData *__return_storage_ptr__,CylHead *cylhead,Track *track)

{
  int iVar1;
  BitBuffer *bitstream;
  BitstreamTrackBuilder bitbuf;
  BitstreamTrackBuilder BStack_98;
  
  iVar1 = Track::size(track);
  if (iVar1 == 0) {
    BitstreamTrackBuilder::BitstreamTrackBuilder(&BStack_98,_250K,MFM);
    TrackBuilder::addBlock(&BStack_98.super_TrackBuilder,0x4e,0x186a);
    bitstream = BitstreamTrackBuilder::buffer(&BStack_98);
    TrackData::TrackData(__return_storage_ptr__,cylhead,bitstream);
    if (BStack_98.m_buffer.m_sync_losses.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(BStack_98.m_buffer.m_sync_losses.super__Vector_base<int,_std::allocator<int>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)BStack_98.m_buffer.m_sync_losses.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)BStack_98.m_buffer.m_sync_losses.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (BStack_98.m_buffer.m_indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(BStack_98.m_buffer.m_indexes.super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)BStack_98.m_buffer.m_indexes.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)BStack_98.m_buffer.m_indexes.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (BStack_98.m_buffer.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(BStack_98.m_buffer.m_data.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)BStack_98.m_buffer.m_data.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)BStack_98.m_buffer.m_data.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("IsEmptyTrack(track)",
                "/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/SpecialFormat.cpp"
                ,0x15,"TrackData GenerateEmptyTrack(const CylHead &, const Track &)");
}

Assistant:

TrackData GenerateEmptyTrack(const CylHead& cylhead, const Track& track)
{
    assert(IsEmptyTrack(track));
    (void)track;

    // Generate a DD track full of gap filler. It shouldn't really matter
    // which datarate and encoding as long as there are no sync marks.
    BitstreamTrackBuilder bitbuf(DataRate::_250K, Encoding::MFM);
    bitbuf.addBlock(0x4e, 6250);

    return TrackData(cylhead, std::move(bitbuf.buffer()));
}